

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::SubSurfaceMaterial::SubSurfaceMaterial(SubSurfaceMaterial *this,string *name)

{
  Material::Material(&this->super_Material,name);
  (this->super_Material).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__00168670
  ;
  this->uRoughness = 0.0;
  this->vRoughness = 0.0;
  this->remapRoughness = true;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SubSurfaceMaterial(const std::string &name = "") : Material(name) {}